

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void llvm::SmallVectorTemplateBase<unsigned_int,true>::
     uninitialized_copy<unsigned_int_const,unsigned_int>(uint *I,uint *E,uint *Dest,type *param_4)

{
  type *param_3_local;
  uint *Dest_local;
  uint *E_local;
  uint *I_local;
  
  if (I != E) {
    memcpy(Dest,I,((long)E - (long)I >> 2) << 2);
  }
  return;
}

Assistant:

static void uninitialized_copy(
      T1 *I, T1 *E, T2 *Dest,
      typename std::enable_if<std::is_same<typename std::remove_const<T1>::type,
                                           T2>::value>::type * = nullptr) {
    // Use memcpy for PODs iterated by pointers (which includes SmallVector
    // iterators): std::uninitialized_copy optimizes to memmove, but we can
    // use memcpy here. Note that I and E are iterators and thus might be
    // invalid for memcpy if they are equal.
    if (I != E)
      memcpy(Dest, I, (E - I) * sizeof(T));
  }